

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall
irr::video::CNullDriver::CNullDriver
          (CNullDriver *this,void **vtt,IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  array<irr::video::IImageLoader_*> *this_00;
  SMaterial *this_01;
  undefined1 *puVar1;
  _func_int **pp_Var2;
  IFileSystem *pIVar3;
  uint uVar4;
  uint uVar5;
  array<irr::video::IImageWriter_*> *this_02;
  CAttributes *this_03;
  IMeshManipulator *this_04;
  long lVar6;
  anon_class_1_0_00000001 *fn;
  IImageLoader *local_50;
  SExposedVideoData *local_48;
  SMaterial *local_40;
  array<irr::video::IImageWriter_*> *local_38;
  
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_IVideoDriver)._vptr_IVideoDriver = pp_Var2;
  *(void **)((long)&(this->super_IVideoDriver)._vptr_IVideoDriver + (long)pp_Var2[-3]) = vtt[2];
  *(undefined ***)&(this->super_IVideoDriver).field_0x8 = &PTR__IGPUProgrammingServices_002808b8;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IVideoDriver)._vptr_IVideoDriver = pp_Var2;
  *(void **)((long)&(this->super_IVideoDriver)._vptr_IVideoDriver + (long)pp_Var2[-3]) = vtt[3];
  *(undefined8 *)&(this->super_IVideoDriver).field_0x8 = 0x280360;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&(this->super_IVideoDriver).field_0x10 = 0;
  *(undefined8 *)&(this->super_IVideoDriver).field_0x18 = 0;
  this->field_0x28 = 1;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OcclusionQueries).is_sorted = true;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RenderTargets).is_sorted = true;
  this->SharedRenderTarget = (IRenderTarget *)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedDepthTextures).is_sorted = true;
  this_00 = &this->SurfaceLoader;
  this->CurrentRenderTarget = (IRenderTarget *)0x0;
  (this->CurrentRenderTargetSize).Width = 0;
  (this->CurrentRenderTargetSize).Height = 0;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SurfaceLoader).is_sorted = true;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SurfaceWriter).is_sorted = true;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MaterialRenderers).is_sorted = true;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->HWBufferList;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->HWBufferList;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node._M_size = 0;
  this->FileSystem = io;
  (this->ViewPort).LowerRightCorner.X = 0;
  (this->ViewPort).LowerRightCorner.Y = 0;
  local_38 = &this->SurfaceWriter;
  this->MeshManipulator = (IMeshManipulator *)0x0;
  (this->ViewPort).UpperLeftCorner.X = 0;
  (this->ViewPort).UpperLeftCorner.Y = 0;
  this->ScreenSize = *screenSize;
  (this->TransformationMatrix).M[9] = 0.0;
  (this->TransformationMatrix).M[10] = 0.0;
  (this->TransformationMatrix).M[0xb] = 0.0;
  (this->TransformationMatrix).M[0xc] = 0.0;
  (this->TransformationMatrix).M[0xd] = 0.0;
  (this->TransformationMatrix).M[0xe] = 0.0;
  (this->TransformationMatrix).M[5] = 0.0;
  (this->TransformationMatrix).M[6] = 0.0;
  (this->TransformationMatrix).M[7] = 0.0;
  (this->TransformationMatrix).M[8] = 0.0;
  (this->TransformationMatrix).M[1] = 0.0;
  (this->TransformationMatrix).M[2] = 0.0;
  (this->TransformationMatrix).M[3] = 0.0;
  (this->TransformationMatrix).M[4] = 0.0;
  (this->TransformationMatrix).M[0xf] = 1.0;
  (this->TransformationMatrix).M[10] = 1.0;
  (this->TransformationMatrix).M[5] = 1.0;
  (this->TransformationMatrix).M[0] = 1.0;
  CFPSCounter::CFPSCounter(&this->FPSCounter);
  this->PrimitivesDrawn = 0;
  this->MinVertexCountForVBO = 500;
  this->TextureCreationFlags = 0;
  local_48 = &this->ExposedData;
  (this->ExposedData).field_0.OpenGLWin32.HDc = (void *)0x0;
  (this->ExposedData).field_0.OpenGLWin32.HRc = (void *)0x0;
  (this->ExposedData).field_0.OpenGLWin32.HWnd = (void *)0x0;
  SOverrideMaterial::SOverrideMaterial(&this->OverrideMaterial);
  local_40 = &this->OverrideMaterial2D;
  SMaterial::SMaterial(local_40);
  this_01 = &this->InitMaterial2D;
  SMaterial::SMaterial(this_01);
  this->OverrideMaterial2DEnabled = false;
  this->AllowZWriteOnTransparent = false;
  (this->AmbientLight).r = 0.0;
  (this->AmbientLight).g = 0.0;
  (this->AmbientLight).b = 0.0;
  (this->AmbientLight).a = 1.0;
  this_03 = (CAttributes *)operator_new(0x48);
  irr::io::CAttributes::CAttributes(this_03,(IVideoDriver *)0x0);
  this->DriverAttributes = (IAttributes *)this_03;
  (*(this_03->super_IAttributes)._vptr_IAttributes[7])(this_03,"MaxTextures",4);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxSupportedTextures",4);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxAnisotropy",1);
  (*this->DriverAttributes->_vptr_IAttributes[7])
            (this->DriverAttributes,"MaxMultipleRenderTargets",1);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxIndices",0xffffffff);
  (*this->DriverAttributes->_vptr_IAttributes[7])
            (this->DriverAttributes,"MaxTextureSize",0xffffffff);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"Version",1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x38])
            (0x42480000,0x42c80000,0x3c23d70a,this,0xffffff,1,0,0);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,2,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x10,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x100,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x80,1);
  uVar4 = screenSize->Width;
  uVar5 = screenSize->Height;
  (this->ViewPort).UpperLeftCorner.X = 0;
  (this->ViewPort).UpperLeftCorner.Y = 0;
  (this->ViewPort).LowerRightCorner.X = uVar4;
  (this->ViewPort).LowerRightCorner.Y = uVar5;
  this_04 = (IMeshManipulator *)operator_new(0x20);
  ((IMeshManipulator *)&this_04->_vptr_IMeshManipulator)->_vptr_IMeshManipulator = (_func_int **)0x0
  ;
  *(undefined8 *)&this_04->field_0x8 = 0;
  *(undefined8 *)&this_04->field_0x10 = 0;
  *(undefined8 *)&this_04->field_0x18 = 0;
  irr::scene::CMeshManipulator::CMeshManipulator((CMeshManipulator *)this_04);
  this->MeshManipulator = this_04;
  pIVar3 = this->FileSystem;
  if (pIVar3 != (IFileSystem *)0x0) {
    *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IFileSystem[-3]) =
         *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IFileSystem[-3]) + 1;
  }
  local_50 = createImageLoaderTGA();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,&local_50);
  local_50 = createImageLoaderPNG();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,&local_50);
  local_50 = createImageLoaderJPG();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,&local_50);
  local_50 = createImageLoaderBMP();
  core::array<irr::video::IImageLoader_*>::push_back(this_00,&local_50);
  local_50 = (IImageLoader *)createImageWriterJPG();
  this_02 = local_38;
  core::array<irr::video::IImageWriter_*>::push_back(local_38,(IImageWriter **)&local_50);
  local_50 = (IImageLoader *)createImageWriterPNG();
  fn = (anon_class_1_0_00000001 *)&local_50;
  core::array<irr::video::IImageWriter_*>::push_back(this_02,(IImageWriter **)fn);
  (local_48->field_0).OpenGLWin32.HWnd = (void *)0x0;
  (local_48->field_0).OpenGLLinux.GLXWindow = 0;
  (local_48->field_0).OpenGLWin32.HDc = (void *)0x0;
  (local_48->field_0).OpenGLWin32.HRc = (void *)0x0;
  for (lVar6 = -0x27; lVar6 != 0; lVar6 = lVar6 + 1) {
    this->FeatureEnabled[lVar6 + 0x27] = true;
  }
  (this->InitMaterial2D).ZBuffer = '\0';
  (this->InitMaterial2D).AntiAliasing = '\0';
  puVar1 = &(this->InitMaterial2D).field_0xb0;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfbc7;
  SMaterial::
  forEachTexture<irr::video::CNullDriver::CNullDriver(irr::io::IFileSystem*,irr::core::dimension2d<unsigned_int>const&)::__0>
            (this_01,fn);
  SMaterial::operator=(local_40,this_01);
  return;
}

Assistant:

CNullDriver::CNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize) :
		SharedRenderTarget(0), CurrentRenderTarget(0), CurrentRenderTargetSize(0, 0), FileSystem(io), MeshManipulator(0),
		ViewPort(0, 0, 0, 0), ScreenSize(screenSize), PrimitivesDrawn(0), MinVertexCountForVBO(500),
		TextureCreationFlags(0), OverrideMaterial2DEnabled(false), AllowZWriteOnTransparent(false)
{
#ifdef _DEBUG
	setDebugName("CNullDriver");
#endif

	DriverAttributes = new io::CAttributes();
	DriverAttributes->addInt("MaxTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxSupportedTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxAnisotropy", 1);
	//	DriverAttributes->addInt("MaxUserClipPlanes", 0);
	//	DriverAttributes->addInt("MaxAuxBuffers", 0);
	DriverAttributes->addInt("MaxMultipleRenderTargets", 1);
	DriverAttributes->addInt("MaxIndices", -1);
	DriverAttributes->addInt("MaxTextureSize", -1);
	//	DriverAttributes->addInt("MaxGeometryVerticesOut", 0);
	//	DriverAttributes->addFloat("MaxTextureLODBias", 0.f);
	DriverAttributes->addInt("Version", 1);
	//	DriverAttributes->addInt("ShaderLanguageVersion", 0);
	//	DriverAttributes->addInt("AntiAlias", 0);

	setFog();

	setTextureCreationFlag(ETCF_ALWAYS_32_BIT, true);
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_AUTO_GENERATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY, true);

	ViewPort = core::rect<s32>(core::position2d<s32>(0, 0), core::dimension2di(screenSize));

	// create manipulator
	MeshManipulator = new scene::CMeshManipulator();

	if (FileSystem)
		FileSystem->grab();

	// create surface loaders and writers
	SurfaceLoader.push_back(video::createImageLoaderTGA());
	SurfaceLoader.push_back(video::createImageLoaderPNG());
	SurfaceLoader.push_back(video::createImageLoaderJPG());
	SurfaceLoader.push_back(video::createImageLoaderBMP());

	SurfaceWriter.push_back(video::createImageWriterJPG());
	SurfaceWriter.push_back(video::createImageWriterPNG());

	// set ExposedData to 0
	memset((void *)&ExposedData, 0, sizeof(ExposedData));
	for (u32 i = 0; i < video::EVDF_COUNT; ++i)
		FeatureEnabled[i] = true;

	InitMaterial2D.AntiAliasing = video::EAAM_OFF;
	InitMaterial2D.Lighting = false;
	InitMaterial2D.ZWriteEnable = video::EZW_OFF;
	InitMaterial2D.ZBuffer = video::ECFN_DISABLED;
	InitMaterial2D.UseMipMaps = false;
	InitMaterial2D.forEachTexture([](auto &tex) {
		// Using ETMINF_LINEAR_MIPMAP_NEAREST (bilinear) for 2D graphics looks
		// much better and doesn't have any downsides (e.g. regarding pixel art).
		tex.MinFilter = video::ETMINF_LINEAR_MIPMAP_NEAREST;
		tex.MagFilter = video::ETMAGF_NEAREST;
		tex.TextureWrapU = video::ETC_REPEAT;
		tex.TextureWrapV = video::ETC_REPEAT;
		tex.TextureWrapW = video::ETC_REPEAT;
	});
	OverrideMaterial2D = InitMaterial2D;
}